

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O2

realtype LBasisD3(ARKInterp I,int j,realtype t)

{
  double dVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pvVar3 = I->content;
  uVar2 = *(uint *)((long)pvVar3 + 0x18);
  uVar4 = (ulong)uVar2;
  lVar5 = (long)j;
  uVar6 = (ulong)(uint)j;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  dVar12 = 0.0;
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    if (uVar7 != uVar6) {
      dVar13 = 0.0;
      for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
        if (uVar9 != uVar7 && uVar9 != uVar6) {
          dVar14 = 0.0;
          for (uVar10 = 0; uVar10 != uVar4; uVar10 = uVar10 + 1) {
            if (((uVar10 != uVar9) && (uVar10 != uVar6)) && (uVar10 != uVar7)) {
              dVar15 = 1.0;
              for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
                if (((uVar10 != uVar11) && (uVar9 != uVar11)) &&
                   ((uVar6 != uVar11 && (uVar7 != uVar11)))) {
                  dVar1 = *(double *)(*(long *)((long)pvVar3 + 0x10) + uVar11 * 8);
                  dVar15 = dVar15 * ((t - dVar1) /
                                    (*(double *)(*(long *)((long)pvVar3 + 0x10) + lVar5 * 8) - dVar1
                                    ));
                }
              }
              dVar14 = dVar14 + dVar15 / (*(double *)(*(long *)((long)pvVar3 + 0x10) + lVar5 * 8) -
                                         *(double *)(*(long *)((long)pvVar3 + 0x10) + uVar10 * 8));
            }
          }
          dVar13 = dVar13 + dVar14 / (*(double *)(*(long *)((long)pvVar3 + 0x10) + lVar5 * 8) -
                                     *(double *)(*(long *)((long)pvVar3 + 0x10) + uVar9 * 8));
        }
      }
      dVar12 = dVar12 + dVar13 / (*(double *)(*(long *)((long)pvVar3 + 0x10) + lVar5 * 8) -
                                 *(double *)(*(long *)((long)pvVar3 + 0x10) + uVar7 * 8));
    }
  }
  return dVar12;
}

Assistant:

realtype LBasisD3(ARKInterp I, int j, realtype t)
{
  int i, k, l, m;
  realtype p, q, r, s;
  p = ZERO;
  for (m=0; m<LINT_NHIST(I); m++) {
    if (m == j) continue;
    q = ZERO;
    for (l=0; l<LINT_NHIST(I); l++) {
      if (l == j) continue;
      if (l == m) continue;
      r = ZERO;
      for (i=0; i<LINT_NHIST(I); i++) {
        if (i == j) continue;
        if (i == m) continue;
        if (i == l) continue;
        s = ONE;
        for (k=0; k<LINT_NHIST(I); k++) {
          if (k == j) continue;
          if (k == m) continue;
          if (k == l) continue;
          if (k == i) continue;
          s *= (t-LINT_TJ(I,k))/(LINT_TJ(I,j)-LINT_TJ(I,k));
        }
        r += s/(LINT_TJ(I,j)-LINT_TJ(I,i));
      }
      q += r/(LINT_TJ(I,j)-LINT_TJ(I,l));
    }
    p += q/(LINT_TJ(I,j)-LINT_TJ(I,m));
  }

  return(p);
}